

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O2

int __thiscall booster::streambuf::underflow(streambuf *this)

{
  char *pcVar1;
  int iVar2;
  io_device *piVar3;
  undefined4 extraout_var;
  ulong __new_size;
  char *pcVar4;
  
  pcVar4 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar4 == pcVar1) {
    __new_size = this->buffer_size_;
  }
  else {
    __new_size = this->buffer_size_;
    if ((ulong)((long)pcVar1 - (long)pcVar4) <= __new_size) goto LAB_0017ca49;
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->buffer_in_,__new_size);
  pcVar4 = (this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
LAB_0017ca49:
  piVar3 = device(this);
  iVar2 = (**piVar3->_vptr_io_device)
                    (piVar3,pcVar4,
                     (long)(this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->buffer_in_).super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
  *(char **)&this->field_0x8 = pcVar4;
  *(char **)&this->field_0x10 = pcVar4;
  *(char **)&this->field_0x18 = pcVar4 + CONCAT44(extraout_var,iVar2);
  return -(uint)(CONCAT44(extraout_var,iVar2) == 0) | (int)*pcVar4;
}

Assistant:

int streambuf::underflow()
	{
		if(buffer_in_.empty() || buffer_in_.size() > buffer_size_)
			buffer_in_.resize(buffer_size_);
		char *buf_ptr = &buffer_in_.front();
		std::streamsize n=device().read(buf_ptr,buffer_in_.size());
		setg(buf_ptr,buf_ptr,buf_ptr+n);
		if(n==0)
			return EOF;
		return *buf_ptr;
	}